

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play_song.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  char *pcVar3;
  bool bVar4;
  bool local_269;
  uchar local_259 [9];
  float durations [9];
  uint8_t notes [9];
  uint8_t song_len;
  float sixteenth;
  float dotted_eigth;
  float quarter;
  float half;
  uint8_t DS;
  uint8_t AS;
  uint8_t G;
  Create local_1e8 [8];
  Create robot;
  allocator local_91;
  string local_90 [32];
  undefined4 local_70;
  int baud;
  allocator local_59;
  string local_58 [8];
  string port;
  RobotModel model;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"/dev/ttyUSB0",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_70 = 0x1c200;
  local_269 = false;
  if (1 < argc) {
    pcVar3 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar3,&local_91);
    local_269 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"create1");
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  if (local_269 == false) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Running driver for Create 2");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_70 = 0xe100;
    poVar2 = std::operator<<((ostream *)&std::cout,"Running driver for Create 1");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  create::Create::Create(local_1e8,1);
  bVar1 = create::Create::connect((string *)local_1e8,(int *)local_58);
  bVar4 = (bVar1 & 1) != 0;
  if (bVar4) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Connected to robot");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    create::Create::setMode((CreateMode *)local_1e8);
    stack0xfffffffffffffde0 = 0x3ec00000;
    notes[4] = '\0';
    notes[5] = '\0';
    notes[6] = '\0';
    notes[7] = '>';
    notes[3] = '\t';
    stack0xfffffffffffffdd0 = 0x3a33373a33373737;
    notes[0] = '7';
    durations[2] = 0.125;
    durations[3] = 0.5;
    durations[4] = 0.375;
    durations[5] = 0.125;
    local_259[1] = '\0';
    local_259[2] = '\0';
    local_259[3] = '\0';
    local_259[4] = '?';
    local_259[5] = '\0';
    local_259[6] = '\0';
    local_259[7] = '\0';
    local_259[8] = '?';
    durations[0] = 0.5;
    durations[1] = 0.375;
    durations[6] = 1.0;
    local_259[0] = '\0';
    create::Create::defineSong((uchar *)local_1e8,local_259,notes + 3,durations + 8);
    usleep(1000000);
    poVar2 = std::operator<<((ostream *)&std::cout,"Playing a song!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    create::Create::playSong((uchar *)local_1e8);
    usleep(4500000);
    create::Create::disconnect();
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Failed to connect to robot on port ");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  argv_local._4_4_ = (uint)!bVar4;
  create::Create::~Create(local_1e8);
  std::__cxx11::string::~string(local_58);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  // Useful note defintions
  const uint8_t G = 55;
  const uint8_t AS = 58;
  const uint8_t DS = 51;
  const float half = 1.0f;
  const float quarter = 0.5f;
  const float dotted_eigth = 0.375f;
  const float sixteenth = 0.125f;

  // Define a song
  const uint8_t song_len = 9;
  const uint8_t notes[song_len] = { G, G, G, DS, AS, G, DS, AS, G };
  const float durations[song_len] = { quarter, quarter, quarter, dotted_eigth, sixteenth, quarter, dotted_eigth, sixteenth, half };
  robot.defineSong(0, song_len, notes, durations);

  // Sleep to provide time for song to register
  usleep(1000000);

  std::cout << "Playing a song!" << std::endl;

  // Request to play the song we just defined
  robot.playSong(0);

  // Expect the song to take about four seconds
  usleep(4500000);

  // Call disconnect to avoid leaving robot in Full mode
  robot.disconnect();

  return 0;
}